

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastaParser.h
# Opt level: O0

unordered_set<std::string> * parseFasta(string *fileName)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  ostream *poVar4;
  runtime_error *this;
  istream *__pos;
  string *in_RSI;
  unordered_set<std::string> *in_RDI;
  string DNA_sequence;
  string seq_id;
  string line;
  ifstream input;
  unordered_set<std::string> *sequences;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffcc0;
  unordered_set<std::string> *this_00;
  string local_298 [39];
  undefined1 local_271;
  string local_250 [48];
  istream local_220 [527];
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(in_stack_fffffffffffffc80);
  std::ifstream::ifstream(local_220,local_10,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(in_stack_fffffffffffffc90);
    std::__cxx11::string::string(in_stack_fffffffffffffc90);
    std::__cxx11::string::string(in_stack_fffffffffffffc90);
    while( true ) {
      __pos = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_298);
      uVar2 = std::ios::operator_cast_to_bool((ios *)(__pos + *(long *)(*(long *)__pos + -0x18)));
      if (!(bool)uVar2) break;
      bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x17a9b0);
      if (!bVar3) {
        in_stack_fffffffffffffc80 =
             (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        if (*(char *)&((_Alloc_hider *)&in_stack_fffffffffffffc80->mHashMultiplier)->_M_p == '>') {
          bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x17aa2a);
          if (!bVar3) {
            robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_fffffffffffffc98,(size_type)__pos,
                     CONCAT17(uVar2,in_stack_fffffffffffffc88));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc80);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17aa95);
        }
        else {
          in_stack_fffffffffffffc78 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
          if (*(char *)&(in_stack_fffffffffffffc78->_M_dataplus)._M_p != ';') {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          }
        }
      }
    }
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17aaec
                      );
    if (!bVar3) {
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    }
    local_11 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    std::ifstream::~ifstream(local_220);
    if ((local_11 & 1) == 0) {
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~Table((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x17ab6c);
    }
    return this_00;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[!] ");
  poVar4 = std::operator<<(poVar4,"Error opening: ");
  poVar4 = std::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(poVar4,". ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_271 = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffcc0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (char *)in_stack_fffffffffffffc80);
  std::runtime_error::runtime_error(this,local_250);
  local_271 = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

robin_hood::unordered_set<std::string> parseFasta(const std::string &fileName) {
    /*
     * Parses a fasta file and returns a set of all sequences.
     */
    robin_hood::unordered_set<std::string> sequences = robin_hood::unordered_set<std::string>();
    std::ifstream input(fileName);
    if (!input.good()) {
        ERROR("Error opening: " << fileName << ". ");
        throw std::runtime_error("Error opening: " + fileName + " .");
    }
    std::string line, seq_id, DNA_sequence;

    while (std::getline(input, line)) {
        // line may be empty so you *must* ignore blank lines
        // or you have a crash waiting to happen with line[0]
        if (line.empty())
            continue;

        if (line[0] == '>') {
            // output previous line before overwriting seq_id
            // but ONLY if seq_id actually contains something
            if (!seq_id.empty())
                sequences.insert(DNA_sequence);
            seq_id = line.substr(1);
            DNA_sequence.clear();
        } else if (line[0] == ';') {
            //skip comment lines
            continue;
        } else {
            DNA_sequence += line;
        }
    }

    // output final entry ONLY if seq_id actually contains something
    if (!seq_id.empty())
        sequences.insert(DNA_sequence);
    return sequences;
}